

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

MetaIterator * __thiscall rtosc::Port::MetaIterator::operator++(MetaIterator *this)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  
  pcVar1 = this->title;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    this->title = (char *)0x0;
  }
  else {
    cVar3 = '\0';
    while ((pcVar2 = pcVar1 + 1, cVar3 != '\0' ||
           ((cVar3 = *pcVar1, cVar3 != '\0' && (cVar3 != ':'))))) {
      this->title = pcVar2;
      cVar3 = *pcVar1;
      pcVar1 = pcVar2;
    }
    if (cVar3 == '\0') {
      pcVar2 = (char *)0x0;
    }
    this->title = pcVar2;
    metaiterator_advance(&this->title,&this->value);
  }
  return this;
}

Assistant:

Port::MetaIterator& Port::MetaIterator::operator++(void)
{
    if(!title || !*title) {
        title = NULL;
        return *this;
    }
    //search for next parameter start
    //aka "\0:" unless "\0\0" is seen
    char prev = 0;
    while(prev || (*title && *title != ':'))
        prev = *title++;

    if(!*title)
        title = NULL;
    else
        ++title;

    metaiterator_advance(title, value);
    return *this;
}